

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::EnumDescriptorProto::MergePartialFromCodedStream
          (EnumDescriptorProto *this,CodedInputStream *input)

{
  uint8 uVar1;
  int iVar2;
  void **ppvVar3;
  bool bVar4;
  uint uVar5;
  Limit LVar6;
  string *value;
  EnumValueDescriptorProto *this_00;
  uint8 *puVar7;
  EnumOptions *this_01;
  uint uVar8;
  uint32 tag;
  int iVar9;
  uint32 local_40;
  uint32 local_3c;
  RepeatedPtrFieldBase *local_38;
  
  local_38 = &(this->value_).super_RepeatedPtrFieldBase;
LAB_001e985d:
  do {
    puVar7 = input->buffer_;
    if ((puVar7 < input->buffer_end_) && (tag = (uint32)(char)*puVar7, -1 < (char)*puVar7)) {
      input->last_tag_ = tag;
      input->buffer_ = puVar7 + 1;
    }
    else {
      tag = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = tag;
    }
    if (tag == 0) {
      return true;
    }
    uVar8 = tag >> 3;
    uVar5 = tag & 7;
    if (uVar8 != 3) {
      if (uVar8 == 2) {
        if (uVar5 == 2) goto LAB_001e9964;
      }
      else if ((uVar8 == 1) && (uVar5 == 2)) {
        *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
        value = this->name_;
        if (value == (string *)internal::kEmptyString_abi_cxx11_) {
          value = (string *)operator_new(0x20);
          (value->_M_dataplus)._M_p = (pointer)&value->field_2;
          value->_M_string_length = 0;
          (value->field_2)._M_local_buf[0] = '\0';
          this->name_ = value;
        }
        bVar4 = internal::WireFormatLite::ReadString(input,value);
        if (!bVar4) {
          return false;
        }
        internal::WireFormat::VerifyUTF8StringFallback
                  ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,PARSE);
        puVar7 = input->buffer_;
        if ((puVar7 < input->buffer_end_) && (*puVar7 == '\x12')) {
          do {
            input->buffer_ = puVar7 + 1;
LAB_001e9964:
            iVar2 = (this->value_).super_RepeatedPtrFieldBase.current_size_;
            iVar9 = (this->value_).super_RepeatedPtrFieldBase.allocated_size_;
            if (iVar2 < iVar9) {
              ppvVar3 = (this->value_).super_RepeatedPtrFieldBase.elements_;
              (this->value_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
              this_00 = (EnumValueDescriptorProto *)ppvVar3[iVar2];
            }
            else {
              if (iVar9 == (this->value_).super_RepeatedPtrFieldBase.total_size_) {
                internal::RepeatedPtrFieldBase::Reserve(local_38,iVar9 + 1);
                iVar9 = (this->value_).super_RepeatedPtrFieldBase.allocated_size_;
              }
              (this->value_).super_RepeatedPtrFieldBase.allocated_size_ = iVar9 + 1;
              this_00 = internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>::
                        New();
              ppvVar3 = (this->value_).super_RepeatedPtrFieldBase.elements_;
              iVar2 = (this->value_).super_RepeatedPtrFieldBase.current_size_;
              (this->value_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
              ppvVar3[iVar2] = this_00;
            }
            puVar7 = input->buffer_;
            if ((puVar7 < input->buffer_end_) && (uVar1 = *puVar7, -1 < (char)uVar1)) {
              input->buffer_ = puVar7 + 1;
              local_40 = (int)(char)uVar1;
            }
            else {
              bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_40);
              if (!bVar4) {
                return false;
              }
            }
            iVar2 = input->recursion_depth_;
            input->recursion_depth_ = iVar2 + 1;
            if (input->recursion_limit_ <= iVar2) {
              return false;
            }
            LVar6 = io::CodedInputStream::PushLimit(input,local_40);
            bVar4 = EnumValueDescriptorProto::MergePartialFromCodedStream(this_00,input);
            if (!bVar4) {
              return false;
            }
            if (input->legitimate_message_end_ != true) {
              return false;
            }
            io::CodedInputStream::PopLimit(input,LVar6);
            if (0 < input->recursion_depth_) {
              input->recursion_depth_ = input->recursion_depth_ + -1;
            }
            puVar7 = input->buffer_;
            if (input->buffer_end_ <= puVar7) goto LAB_001e985d;
          } while (*puVar7 == '\x12');
          if (*puVar7 == '\x1a') {
            input->buffer_ = puVar7 + 1;
            goto LAB_001e9a6f;
          }
        }
        goto LAB_001e985d;
      }
LAB_001e9943:
      if (uVar5 == 4) {
        return true;
      }
      bVar4 = internal::WireFormat::SkipField(input,tag,&this->_unknown_fields_);
      if (!bVar4) {
        return false;
      }
      goto LAB_001e985d;
    }
    if (uVar5 != 2) goto LAB_001e9943;
LAB_001e9a6f:
    *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 4;
    this_01 = this->options_;
    if (this_01 == (EnumOptions *)0x0) {
      this_01 = (EnumOptions *)operator_new(0x68);
      EnumOptions::EnumOptions(this_01);
      this->options_ = this_01;
    }
    puVar7 = input->buffer_;
    if ((puVar7 < input->buffer_end_) && (uVar1 = *puVar7, -1 < (char)uVar1)) {
      input->buffer_ = puVar7 + 1;
      local_3c = (int)(char)uVar1;
    }
    else {
      bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_3c);
      if (!bVar4) {
        return false;
      }
    }
    iVar2 = input->recursion_depth_;
    input->recursion_depth_ = iVar2 + 1;
    if (input->recursion_limit_ <= iVar2) {
      return false;
    }
    LVar6 = io::CodedInputStream::PushLimit(input,local_3c);
    bVar4 = EnumOptions::MergePartialFromCodedStream(this_01,input);
    if (!bVar4) {
      return false;
    }
    if (input->legitimate_message_end_ != true) {
      return false;
    }
    io::CodedInputStream::PopLimit(input,LVar6);
    if (0 < input->recursion_depth_) {
      input->recursion_depth_ = input->recursion_depth_ + -1;
    }
    if ((input->buffer_ == input->buffer_end_) &&
       ((input->buffer_size_after_limit_ != 0 || (input->total_bytes_read_ == input->current_limit_)
        ))) {
      input->last_tag_ = 0;
      input->legitimate_message_end_ = true;
      return true;
    }
  } while( true );
}

Assistant:

bool EnumDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_value;
        break;
      }

      // repeated .google.protobuf.EnumValueDescriptorProto value = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_value:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_value()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_value;
        if (input->ExpectTag(26)) goto parse_options;
        break;
      }

      // optional .google.protobuf.EnumOptions options = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_options:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}